

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O3

LY_ERR lyd_parse_json_restconf
                 (ly_ctx *ctx,lysc_ext_instance *ext,lyd_node *parent,lyd_node **first_p,ly_in *in,
                 uint32_t parse_opts,uint32_t val_opts,lyd_type data_type,lyd_node **envp,
                 ly_set *parsed,lyd_ctx **lydctx_p)

{
  lyjson_ctx *plVar1;
  lyd_node *plVar2;
  lyd_node *node;
  lyd_json_ctx *lydctx;
  LY_ERR LVar3;
  LYJSON_PARSER_STATUS LVar4;
  int iVar5;
  LY_ERR LVar6;
  lys_module *plVar7;
  ly_err_item *plVar8;
  char *pcVar9;
  char *pcVar10;
  lyd_node **first_p_00;
  uint32_t int_opts;
  LY_ERR LVar11;
  lyd_json_ctx *local_50;
  undefined4 local_44;
  lyd_node **local_40;
  uint32_t local_34;
  
  local_50 = (lyd_json_ctx *)0x0;
  if (((ctx == (ly_ctx *)0x0) || (in == (ly_in *)0x0)) || (lydctx_p == (lyd_ctx **)0x0)) {
    __assert_fail("ctx && in && lydctx_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7da,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if ((short)parse_opts != 0) {
    __assert_fail("!(parse_opts & ~LYD_PARSE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7db,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  local_40 = first_p;
  if (0xffff < val_opts) {
    __assert_fail("!(val_opts & ~LYD_VALIDATE_OPTS_MASK)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7dc,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if (2 < data_type - LYD_TYPE_RPC_RESTCONF) {
    __assert_fail("(data_type == LYD_TYPE_RPC_RESTCONF) || (data_type == LYD_TYPE_NOTIF_RESTCONF) || (data_type == LYD_TYPE_REPLY_RESTCONF)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7df,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if ((parse_opts >> 0x16 & 1) != 0) {
    __assert_fail("!(parse_opts & LYD_PARSE_SUBTREE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x7e0,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  LVar3 = lyd_parse_json_init(ctx,in,parse_opts,val_opts,&local_50);
  first_p_00 = local_40;
  if (LVar3 != LY_SUCCESS) goto LAB_00135c2a;
  local_50->ext = ext;
  if (data_type == LYD_TYPE_REPLY_RESTCONF) {
    if (parent == (lyd_node *)0x0) {
      __assert_fail("parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                    ,0x7fe,
                    "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                   );
    }
    plVar1 = local_50->jsonctx;
    plVar7 = lyd_node_module(parent);
    LVar3 = lydjson_envelope(plVar1,"output",plVar7->name,envp);
    if (LVar3 != LY_SUCCESS) goto LAB_00135c2a;
    int_opts = 0x24;
    first_p_00 = local_40;
LAB_00135da5:
    local_44 = 1;
  }
  else {
    if (data_type != LYD_TYPE_NOTIF_RESTCONF) {
      if (parent == (lyd_node *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                      ,0x7e9,
                      "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                     );
      }
      plVar1 = local_50->jsonctx;
      plVar7 = lyd_node_module(parent);
      LVar3 = lydjson_envelope(plVar1,"input",plVar7->name,envp);
      if (LVar3 != LY_SUCCESS) goto LAB_00135c2a;
      int_opts = 0x23;
      goto LAB_00135da5;
    }
    if (parent != (lyd_node *)0x0) {
      __assert_fail("!parent",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                    ,0x7f3,
                    "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                   );
    }
    LVar3 = lydjson_envelope(local_50->jsonctx,"notification","ietf-restconf",envp);
    if (LVar3 != LY_SUCCESS) goto LAB_00135c2a;
    int_opts = 0xa8;
    local_44 = 0;
  }
  local_50->int_opts = int_opts;
  LVar3 = lyd_parser_find_operation(parent,int_opts,&local_50->op_node);
  if (LVar3 == LY_SUCCESS) {
    LVar11 = LY_SUCCESS;
    local_34 = int_opts;
    do {
      LVar3 = lydjson_subtree_r(local_50,parent,first_p_00,parsed);
      if (LVar3 != LY_SUCCESS) {
        plVar8 = ly_err_last(local_50->jsonctx->ctx);
        if ((LVar3 != LY_EVALID) || (local_50 == (lyd_json_ctx *)0x0)) goto LAB_00135c2a;
        if ((local_50->val_opts & 4) == 0) goto LAB_00135f5e;
        LVar11 = LY_EVALID;
        LVar3 = LY_EVALID;
        if (plVar8->vecode == LYVE_SYNTAX) goto LAB_00135c2a;
      }
      LVar4 = lyjson_ctx_status(local_50->jsonctx);
    } while (LVar4 == LYJSON_OBJECT_NEXT);
    LVar4 = lyjson_ctx_status(local_50->jsonctx);
    if (LVar4 == LYJSON_OBJECT_CLOSED) {
      LVar3 = lyjson_ctx_next(local_50->jsonctx,(LYJSON_PARSER_STATUS *)0x0);
      if (LVar3 == LY_SUCCESS) {
        if (((local_34 & 0xf) != 0) && (local_50->op_node == (lyd_node *)0x0)) {
          ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Missing the operation node.");
          plVar8 = ly_err_last(local_50->jsonctx->ctx);
          LVar3 = LY_EVALID;
          if ((local_50 == (lyd_json_ctx *)0x0) ||
             (((local_50->val_opts & 4) == 0 || (LVar11 = LY_EVALID, plVar8->vecode == LYVE_SYNTAX))
             )) goto LAB_00135c2a;
        }
        if ((char)local_44 == '\0') {
          plVar2 = *first_p_00;
          node = plVar2->prev;
          if (node->schema == (lysc_node *)0x0) {
            iVar5 = strcmp((char *)node[1].schema,"eventTime");
            if ((iVar5 != 0) || (plVar2->next == (lyd_node *)0x0)) {
              __assert_fail("!strcmp(LYD_NAME(node), \"eventTime\") && (*first_p)->next",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                            ,0x833,
                            "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                           );
            }
            lyd_unlink(node);
            if (*envp == (lyd_node *)0x0) {
              __assert_fail("*envp",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                            ,0x835,
                            "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                           );
            }
            lyd_insert_child(*envp,node);
            first_p_00 = local_40;
          }
          else {
            ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Missing notification \"eventTime\" node.");
            plVar8 = ly_err_last(local_50->jsonctx->ctx);
            LVar3 = LY_EVALID;
            if (((local_50 == (lyd_json_ctx *)0x0) || ((local_50->val_opts & 4) == 0)) ||
               (LVar11 = LY_EVALID, first_p_00 = local_40, plVar8->vecode == LYVE_SYNTAX))
            goto LAB_00135c2a;
          }
        }
        lydctx = local_50;
        if (parent != (lyd_node *)0x0) {
          first_p_00 = lyd_node_child_p(parent);
        }
        LVar6 = lydjson_metadata_finish(lydctx,first_p_00);
        LVar3 = LVar11;
        if (LVar6 != LY_SUCCESS) {
          LVar3 = LVar6;
        }
      }
    }
    else {
      pcVar9 = lyjson_token2str(LYJSON_OBJECT_CLOSED);
      LVar4 = lyjson_ctx_status(local_50->jsonctx);
      pcVar10 = lyjson_token2str(LVar4);
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",pcVar9,pcVar10);
LAB_00135f5e:
      LVar3 = LY_EVALID;
    }
  }
LAB_00135c2a:
  if (((local_50 != (lyd_json_ctx *)0x0 & (byte)(parse_opts >> 0x10)) == 1) &&
     ((((local_50->node_types).count != 0 || ((local_50->meta_types).count != 0)) ||
      ((local_50->node_when).count != 0)))) {
    __assert_fail("!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count && !lydctx->node_when.count)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x841,
                  "LY_ERR lyd_parse_json_restconf(const struct ly_ctx *, const struct lysc_ext_instance *, struct lyd_node *, struct lyd_node **, struct ly_in *, uint32_t, uint32_t, enum lyd_type, struct lyd_node **, struct ly_set *, struct lyd_ctx **)"
                 );
  }
  if (LVar3 == LY_SUCCESS) {
    *lydctx_p = (lyd_ctx *)local_50;
    lyjson_ctx_free(local_50->jsonctx);
    local_50->jsonctx = (lyjson_ctx *)0x0;
  }
  else {
    lyd_json_ctx_free((lyd_ctx *)local_50);
  }
  return LVar3;
}

Assistant:

LY_ERR
lyd_parse_json_restconf(const struct ly_ctx *ctx, const struct lysc_ext_instance *ext, struct lyd_node *parent,
        struct lyd_node **first_p, struct ly_in *in, uint32_t parse_opts, uint32_t val_opts, enum lyd_type data_type,
        struct lyd_node **envp, struct ly_set *parsed, struct lyd_ctx **lydctx_p)
{
    LY_ERR rc = LY_SUCCESS, r;
    struct lyd_json_ctx *lydctx = NULL;
    struct lyd_node *node;
    uint32_t i, int_opts = 0, close_elem = 0;

    assert(ctx && in && lydctx_p);
    assert(!(parse_opts & ~LYD_PARSE_OPTS_MASK));
    assert(!(val_opts & ~LYD_VALIDATE_OPTS_MASK));

    assert((data_type == LYD_TYPE_RPC_RESTCONF) || (data_type == LYD_TYPE_NOTIF_RESTCONF) ||
            (data_type == LYD_TYPE_REPLY_RESTCONF));
    assert(!(parse_opts & LYD_PARSE_SUBTREE));

    /* init context */
    rc = lyd_parse_json_init(ctx, in, parse_opts, val_opts, &lydctx);
    LY_CHECK_GOTO(rc, cleanup);
    lydctx->ext = ext;

    switch (data_type) {
    case LYD_TYPE_RPC_RESTCONF:
        assert(parent);

        /* parse "input" */
        rc = lydjson_envelope(lydctx->jsonctx, "input", lyd_node_module(parent)->name, envp);
        LY_CHECK_GOTO(rc, cleanup);

        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_RPC | LYD_INTOPT_ACTION;
        close_elem = 1;
        break;
    case LYD_TYPE_NOTIF_RESTCONF:
        assert(!parent);

        /* parse "notification" */
        rc = lydjson_envelope(lydctx->jsonctx, "notification", "ietf-restconf", envp);
        LY_CHECK_GOTO(rc, cleanup);

        /* RESTCONF notification and eventTime */
        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_NOTIF | LYD_INTOPT_EVENTTIME;
        close_elem = 1;
        break;
    case LYD_TYPE_REPLY_RESTCONF:
        assert(parent);

        /* parse "output" */
        rc = lydjson_envelope(lydctx->jsonctx, "output", lyd_node_module(parent)->name, envp);
        LY_CHECK_GOTO(rc, cleanup);

        int_opts = LYD_INTOPT_WITH_SIBLINGS | LYD_INTOPT_REPLY;
        close_elem = 1;
        break;
    default:
        LOGINT(ctx);
        rc = LY_EINT;
        goto cleanup;
    }

    lydctx->int_opts = int_opts;

    /* find the operation node if it exists already */
    LY_CHECK_GOTO(rc = lyd_parser_find_operation(parent, int_opts, &lydctx->op_node), cleanup);

    /* read subtree(s) */
    do {
        r = lydjson_subtree_r(lydctx, parent, first_p, parsed);
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    } while (lyjson_ctx_status(lydctx->jsonctx) == LYJSON_OBJECT_NEXT);

    /* close all opened elements */
    for (i = 0; i < close_elem; ++i) {
        if (lyjson_ctx_status(lydctx->jsonctx) != LYJSON_OBJECT_CLOSED) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_OBJECT_CLOSED),
                    lyjson_token2str(lyjson_ctx_status(lydctx->jsonctx)));
            rc = LY_EVALID;
            goto cleanup;
        }

        r = lyjson_ctx_next(lydctx->jsonctx, NULL);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    if ((int_opts & (LYD_INTOPT_RPC | LYD_INTOPT_ACTION | LYD_INTOPT_NOTIF | LYD_INTOPT_REPLY)) && !lydctx->op_node) {
        LOGVAL(ctx, LYVE_DATA, "Missing the operation node.");
        r = LY_EVALID;
        LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
    }
    if (int_opts & LYD_INTOPT_EVENTTIME) {
        /* parse as a child of the envelope */
        node = (*first_p)->prev;
        if (node->schema) {
            LOGVAL(ctx, LYVE_DATA, "Missing notification \"eventTime\" node.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else {
            /* can be the only opaque node and an operation had to be parsed */
            assert(!strcmp(LYD_NAME(node), "eventTime") && (*first_p)->next);
            lyd_unlink(node);
            assert(*envp);
            lyd_insert_child(*envp, node);
        }
    }

    /* finish linking metadata */
    r = lydjson_metadata_finish(lydctx, parent ? lyd_node_child_p(parent) : first_p);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

cleanup:
    /* there should be no unres stored if validation should be skipped */
    assert(!(parse_opts & LYD_PARSE_ONLY) || !lydctx || (!lydctx->node_types.count && !lydctx->meta_types.count &&
            !lydctx->node_when.count));

    if (rc) {
        lyd_json_ctx_free((struct lyd_ctx *)lydctx);
    } else {
        *lydctx_p = (struct lyd_ctx *)lydctx;

        /* the JSON context is no more needed, freeing it also stops logging line numbers which would be confusing now */
        lyjson_ctx_free(lydctx->jsonctx);
        lydctx->jsonctx = NULL;
    }
    return rc;
}